

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

void __thiscall cmComputeTargetDepends::DisplaySideEffects(cmComputeTargetDepends *this)

{
  FILE *pFVar1;
  cmComputeTargetDepends *pcVar2;
  map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
  *this_00;
  uint uVar3;
  string *psVar4;
  pointer pTVar5;
  uint *puVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  cmGeneratorTarget *gt;
  FILE *local_50;
  cmComputeTargetDepends *local_48;
  map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
  *local_40;
  ulong local_38;
  
  fwrite("The side effects are:\n",0x16,1,_stderr);
  uVar3 = (uint)(((long)(this->SideEffects).
                        super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->SideEffects).
                       super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x60);
  if (0 < (int)uVar3) {
    local_40 = &this->TargetIndex;
    local_38 = (ulong)(uVar3 & 0x7fffffff);
    uVar9 = 0;
    local_48 = this;
    do {
      pcVar2 = local_48;
      pFVar1 = _stderr;
      psVar4 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((local_48->Targets).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar9]);
      fprintf(pFVar1,"target %d is [%s]\n",uVar9 & 0xffffffff,(psVar4->_M_dataplus)._M_p);
      pTVar5 = (pcVar2->SideEffects).
               super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(size_t *)((long)&pTVar5[uVar9].CustomCommandSideEffects._M_t._M_impl + 0x28) != 0) {
        fwrite("  custom commands\n",0x12,1,_stderr);
        this_00 = local_40;
        pTVar5 = (pcVar2->SideEffects).
                 super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var7 = (_Rb_tree_node_base *)
                 ((long)&pTVar5[uVar9].CustomCommandSideEffects._M_t._M_impl + 8);
        p_Var8 = *(_Base_ptr *)((long)&pTVar5[uVar9].CustomCommandSideEffects._M_t._M_impl + 0x18);
        if (p_Var8 != p_Var7) {
          do {
            gt = *(cmGeneratorTarget **)(p_Var8 + 1);
            local_50 = _stderr;
            puVar6 = (uint *)std::
                             map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                             ::operator[](this_00,&gt);
            uVar3 = *puVar6;
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
            fprintf(local_50,"    from target %d [%s]\n",(ulong)uVar3,(psVar4->_M_dataplus)._M_p);
            p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
          } while (p_Var8 != p_Var7);
          pTVar5 = (local_48->SideEffects).
                   super__Vector_base<cmComputeTargetDepends::TargetSideEffects,_std::allocator<cmComputeTargetDepends::TargetSideEffects>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      local_50 = (FILE *)((long)&pTVar5[uVar9].LanguageSideEffects._M_t._M_impl + 8);
      p_Var8 = *(_Base_ptr *)((long)&pTVar5[uVar9].LanguageSideEffects._M_t._M_impl + 0x18);
      if ((FILE *)p_Var8 != local_50) {
        do {
          fprintf(_stderr,"  language %s\n",*(undefined8 *)(p_Var8 + 1));
          p_Var7 = p_Var8[2]._M_right;
          pFVar1 = _stderr;
          while (_stderr = pFVar1, p_Var7 != (_Rb_tree_node_base *)&p_Var8[2]._M_parent) {
            gt = *(cmGeneratorTarget **)(p_Var7 + 1);
            puVar6 = (uint *)std::
                             map<const_cmGeneratorTarget_*,_int,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_int>_>_>
                             ::operator[](local_40,&gt);
            uVar3 = *puVar6;
            psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
            fprintf(pFVar1,"    from target %d [%s]\n",(ulong)uVar3,(psVar4->_M_dataplus)._M_p);
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
            pFVar1 = _stderr;
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while ((FILE *)p_Var8 != local_50);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_38);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeTargetDepends::DisplaySideEffects()
{
  fprintf(stderr, "The side effects are:\n");
  int n = static_cast<int>(this->SideEffects.size());
  for (int depender_index = 0; depender_index < n; ++depender_index) {
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %d is [%s]\n", depender_index,
            depender->GetName().c_str());
    if (!this->SideEffects[depender_index].CustomCommandSideEffects.empty()) {
      fprintf(stderr, "  custom commands\n");
      for (auto const* gt :
           this->SideEffects[depender_index].CustomCommandSideEffects) {
        fprintf(stderr, "    from target %d [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
    for (auto const& it :
         this->SideEffects[depender_index].LanguageSideEffects) {
      fprintf(stderr, "  language %s\n", it.first.c_str());
      for (auto const* gt : it.second) {
        fprintf(stderr, "    from target %d [%s]\n", this->TargetIndex[gt],
                gt->GetName().c_str());
      }
    }
  }
  fprintf(stderr, "\n");
}